

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  _Bool _Var1;
  size_t length_00;
  size_t length;
  char filtered_string [1024];
  char string [1024];
  char **argv_local;
  int argc_local;
  
  printf("Give me a string and I will tell you if it is a palindrome: ");
  fgets(filtered_string + 0x3f8,0x400,_stdin);
  length_00 = filter_letters(filtered_string + 0x3f8,(char *)&length);
  _Var1 = is_palindrome((char *)&length,length_00);
  if (_Var1) {
    printf("It is indeed a palindrome.\n");
  }
  else {
    printf("It isn\'t a palindrome.\n");
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  char string[STR_LEN];
  char filtered_string[STR_LEN];

  printf("Give me a string and I will tell you if it is a palindrome: ");
  fgets(string, STR_LEN, stdin);

  size_t length = filter_letters(string, filtered_string);

  if (is_palindrome(filtered_string, length)) {
    printf("It is indeed a palindrome.\n");
  } else {
    printf("It isn't a palindrome.\n");
  }

  return 0;
}